

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_clib___index(lua_State *L)

{
  int iVar1;
  TValue *pTVar2;
  ulong uVar3;
  uint uVar4;
  CTState *cts;
  
  pTVar2 = ffi_clib_index(L);
  if ((pTVar2->field_2).it == 0xfffffff5) {
    cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
    cts->L = L;
    uVar4 = cts->tab[*(ushort *)((ulong)(pTVar2->u32).lo + 6)].info;
    if ((uVar4 & 0xf0000000) == 0xc0000000) {
      uVar4 = uVar4 & 0xffff;
      iVar1 = lj_cconv_tv_ct(cts,cts->tab + uVar4,uVar4,L->top + -1,
                             *(uint8_t **)((ulong)(pTVar2->u32).lo + 8));
      if (iVar1 == 0) {
        return 1;
      }
      uVar3 = (ulong)(L->glref).ptr32;
      if (*(uint *)(uVar3 + 0x50) < *(uint *)(uVar3 + 0x54)) {
        return 1;
      }
      lj_gc_step(L);
      return 1;
    }
  }
  L->top[-1].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)pTVar2;
  return 1;
}

Assistant:

LJLIB_CF(ffi_clib___index)	LJLIB_REC(clib_index 1)
{
  TValue *tv = ffi_clib_index(L);
  if (tviscdata(tv)) {
    CTState *cts = ctype_cts(L);
    GCcdata *cd = cdataV(tv);
    CType *s = ctype_get(cts, cd->ctypeid);
    if (ctype_isextern(s->info)) {
      CTypeID sid = ctype_cid(s->info);
      void *sp = *(void **)cdataptr(cd);
      CType *ct = ctype_raw(cts, sid);
      if (lj_cconv_tv_ct(cts, ct, sid, L->top-1, sp))
	lj_gc_check(L);
      return 1;
    }
  }
  copyTV(L, L->top-1, tv);
  return 1;
}